

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

string * __thiscall rcg::Device::getDisplayName_abi_cxx11_(Device *this)

{
  long lVar1;
  string *in_RDI;
  lock_guard<std::mutex> lock;
  string *ret;
  DEVICE_INFO_CMD in_stack_0000043c;
  shared_ptr<const_rcg::GenTLWrapper> *in_stack_00000440;
  Device *in_stack_00000448;
  string *this_00;
  string local_50 [55];
  undefined1 local_19;
  
  this_00 = in_RDI;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)in_RDI,(mutex_type *)in_RDI);
  local_19 = 0;
  (anonymous_namespace)::cDevGetInfo_abi_cxx11_
            (in_stack_00000448,in_stack_00000440,in_stack_0000043c);
  lVar1 = std::__cxx11::string::size();
  if (lVar1 == 0) {
    (anonymous_namespace)::cDevGetInfo_abi_cxx11_
              (in_stack_00000448,in_stack_00000440,in_stack_0000043c);
    std::__cxx11::string::operator=(this_00,local_50);
    std::__cxx11::string::~string(local_50);
  }
  local_19 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x11c376);
  return in_RDI;
}

Assistant:

std::string Device::getDisplayName()
{
  std::lock_guard<std::mutex> lock(mtx);

  // return user defined name if available, otherwise the display name that
  // the producer provides

  std::string ret=cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_USER_DEFINED_NAME);

  if (ret.size() == 0)
  {
    ret=cDevGetInfo(this, gentl, GenTL::DEVICE_INFO_DISPLAYNAME);
  }

  return ret;
}